

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation_context.cpp
# Opt level: O3

void __thiscall CompilationContext::suppressWaring(CompilationContext *this,char *text_id)

{
  int iVar1;
  long *plVar2;
  long *plVar3;
  long *error;
  long lVar4;
  long local_50;
  long lStack_48;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  lVar4 = 8;
  do {
    iVar1 = strcmp(text_id,*(char **)((long)&analyzer_messages[0].intId + lVar4));
    if (iVar1 == 0) {
      suppressWaring(this,*(int *)((long)&__dso_handle + lVar4));
      return;
    }
    lVar4 = lVar4 + 0x18;
  } while (lVar4 != 0x860);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_40,"Cannot suppress warning, text id not found: ","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_40);
  plVar3 = plVar2 + 2;
  if ((long *)*plVar2 == plVar3) {
    local_50 = *plVar3;
    lStack_48 = plVar2[3];
    error = &local_50;
  }
  else {
    local_50 = *plVar3;
    error = (long *)*plVar2;
  }
  *plVar2 = (long)plVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  CompilationContext::error(this,0x1e,(char *)error,0,0);
  if (error != &local_50) {
    operator_delete(error);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  return;
}

Assistant:

void CompilationContext::suppressWaring(const char * text_id)
{
  for (int i = 0; i < sizeof(analyzer_messages) / sizeof(analyzer_messages[0]); i++)
    if (!strcmp(text_id, analyzer_messages[i].textId))
    {
      suppressWaring(analyzer_messages[i].intId);
      return;
    }

  error(30, (string("Cannot suppress warning, text id not found: ") + text_id).c_str(), 0, 0);
}